

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_PlaneSurface * __thiscall ON_PlaneSurface::operator=(ON_PlaneSurface *this,ON_PlaneSurface *src)

{
  ON_PlaneSurface *src_local;
  ON_PlaneSurface *this_local;
  
  if (this != src) {
    ON_Surface::operator=(&this->super_ON_Surface,&src->super_ON_Surface);
    memcpy(&this->m_plane,&src->m_plane,0x80);
    *(undefined8 *)&this->field_0x90 = *(undefined8 *)&src->field_0x90;
    *(undefined8 *)&this->field_0x98 = *(undefined8 *)&src->field_0x98;
    *(undefined8 *)&this->field_0xa0 = *(undefined8 *)&src->field_0xa0;
    *(undefined8 *)&this->field_0xa8 = *(undefined8 *)&src->field_0xa8;
    *(undefined8 *)&this->field_0xb0 = *(undefined8 *)&src->field_0xb0;
    *(undefined8 *)&this->field_0xb8 = *(undefined8 *)&src->field_0xb8;
    *(undefined8 *)&this->field_0xc0 = *(undefined8 *)&src->field_0xc0;
    *(undefined8 *)&this->field_0xc8 = *(undefined8 *)&src->field_0xc8;
  }
  return this;
}

Assistant:

ON_PlaneSurface& ON_PlaneSurface::operator=( const ON_PlaneSurface& src )
{
  if ( this != &src ) {
    ON_Surface::operator=(src);
    m_plane = src.m_plane;
    m_domain[0] = src.m_domain[0];
    m_domain[1] = src.m_domain[1];
    m_extents[0] = src.m_extents[0];
    m_extents[1] = src.m_extents[1];
  }
  return *this;
}